

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.hpp
# Opt level: O1

void __thiscall
Diligent::ShaderResourcesGL::GLResourceAttribs::GLResourceAttribs
          (GLResourceAttribs *this,Char *_Name,SHADER_TYPE _ShaderStages,
          SHADER_RESOURCE_TYPE _ResourceType,PIPELINE_RESOURCE_FLAGS _ResourceFlags,
          Uint32 _ArraySize)

{
  string msg;
  string local_38;
  
  this->Name = _Name;
  this->ShaderStages = _ShaderStages;
  this->ResourceType = _ResourceType;
  this->ResourceFlags = _ResourceFlags;
  this->ArraySize = _ArraySize;
  if (_ShaderStages == SHADER_TYPE_UNKNOWN) {
    FormatString<char[44]>(&local_38,(char (*) [44])"At least one shader stage must be specified");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GLResourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourcesGL.hpp"
               ,0x68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (_ResourceType == SHADER_RESOURCE_TYPE_UNKNOWN) {
    FormatString<char[29]>(&local_38,(char (*) [29])"Unknown shader resource type");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GLResourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourcesGL.hpp"
               ,0x69);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (_ArraySize == 0) {
    FormatString<char[34]>(&local_38,(char (*) [34])"Array size must be greater than 1");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GLResourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourcesGL.hpp"
               ,0x6a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (((this->ResourceFlags & PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER) !=
       PIPELINE_RESOURCE_FLAG_NONE) && (this->ResourceType != SHADER_RESOURCE_TYPE_TEXTURE_SRV)) {
    FormatString<char[73]>
              (&local_38,
               (char (*) [73])
               "PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER is only allowed for texture SRVs");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GLResourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourcesGL.hpp"
               ,0x6c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if ((((this->ResourceFlags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) !=
        PIPELINE_RESOURCE_FLAG_NONE) && (this->ResourceType != SHADER_RESOURCE_TYPE_BUFFER_SRV)) &&
     (this->ResourceType != SHADER_RESOURCE_TYPE_BUFFER_UAV)) {
    FormatString<char[81]>
              (&local_38,
               (char (*) [81])
               "PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER is only allowed for buffer SRVs and UAVs");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GLResourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourcesGL.hpp"
               ,0x6e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

GLResourceAttribs(const Char*             _Name,
                          SHADER_TYPE             _ShaderStages,
                          SHADER_RESOURCE_TYPE    _ResourceType,
                          PIPELINE_RESOURCE_FLAGS _ResourceFlags,
                          Uint32                  _ArraySize) noexcept :
            // clang-format off
            Name         {_Name         },
            ShaderStages {_ShaderStages },
            ResourceType {_ResourceType },
            ResourceFlags{_ResourceFlags},
            ArraySize    {_ArraySize    }
        // clang-format on
        {
            VERIFY(_ShaderStages != SHADER_TYPE_UNKNOWN, "At least one shader stage must be specified");
            VERIFY(_ResourceType != SHADER_RESOURCE_TYPE_UNKNOWN, "Unknown shader resource type");
            VERIFY(_ArraySize >= 1, "Array size must be greater than 1");
            VERIFY((ResourceFlags & PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER) == 0 || ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV,
                   "PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER is only allowed for texture SRVs");
            VERIFY((ResourceFlags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) == 0 || ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV || ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV,
                   "PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER is only allowed for buffer SRVs and UAVs");
        }